

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ImportInfo *pIVar3;
  long lVar4;
  string *psVar5;
  Names local_e0;
  
  bVar2 = IsImported(this);
  if (bVar2) {
    pIVar3 = GetImportInfo(this,config);
    if (pIVar3 == (ImportInfo *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_e0);
    }
    else if (pIVar3->NoSOName == true) {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar3->Location);
    }
    else {
      psVar5 = &pIVar3->SOName;
      lVar4 = std::__cxx11::string::find((char *)psVar5,0x43437b);
      if (lVar4 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar5);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
      }
    }
  }
  else {
    GetLibraryNames(&local_e0,this,config);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_e0.SharedObject.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.SharedObject._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e0.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_e0.SharedObject.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           local_e0.SharedObject.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_e0.SharedObject._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e0.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_e0.SharedObject.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e0.SharedObject._M_string_length;
    local_e0.SharedObject._M_string_length = 0;
    local_e0.SharedObject.field_2._M_local_buf[0] = '\0';
    local_e0.SharedObject._M_dataplus._M_p = (pointer)paVar1;
    Names::~Names(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (info->SOName.find("@rpath/") == 0) {
        return info->SOName.substr(6);
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}